

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

void __thiscall SQVM::Finalize(SQVM *this)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  SQObjectType SVar3;
  uint uVar4;
  SQTable *pSVar5;
  SQObjectPtr *pSVar6;
  long *plVar7;
  SQUnsignedInteger SVar8;
  long lVar9;
  CallInfo local_68;
  
  if (this->_releasehook != (SQRELEASEHOOK)0x0) {
    (*this->_releasehook)(this->_foreignptr,0);
    this->_releasehook = (SQRELEASEHOOK)0x0;
  }
  if (this->_openouters != (SQOuter *)0x0) {
    CloseOuters(this,(this->_stack)._vals);
  }
  pSVar5 = (this->_roottable).super_SQObject._unVal.pTable;
  SVar3 = (this->_roottable).super_SQObject._type;
  (this->_roottable).super_SQObject._type = OT_NULL;
  (this->_roottable).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar5 = (this->_lasterror).super_SQObject._unVal.pTable;
  SVar3 = (this->_lasterror).super_SQObject._type;
  (this->_lasterror).super_SQObject._type = OT_NULL;
  (this->_lasterror).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar5 = (this->_errorhandler).super_SQObject._unVal.pTable;
  SVar3 = (this->_errorhandler).super_SQObject._type;
  (this->_errorhandler).super_SQObject._type = OT_NULL;
  (this->_errorhandler).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  this->_debughook = false;
  this->_debughook_native = (SQDEBUGHOOK)0x0;
  pSVar5 = (this->_debughook_closure).super_SQObject._unVal.pTable;
  SVar3 = (this->_debughook_closure).super_SQObject._type;
  (this->_debughook_closure).super_SQObject._type = OT_NULL;
  (this->_debughook_closure).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar5 = (this->temp_reg).super_SQObject._unVal.pTable;
  SVar3 = (this->temp_reg).super_SQObject._type;
  (this->temp_reg).super_SQObject._type = OT_NULL;
  (this->temp_reg).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  local_68._closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_68._prevtop = 0;
  local_68._target = 0;
  local_68._ncalls = 0;
  local_68._60_4_ = 0;
  local_68._generator = (SQGenerator *)0x0;
  local_68._etraps = 0;
  local_68._prevstkbase = 0;
  local_68._ip = (SQInstruction *)0x0;
  local_68._literals = (SQObjectPtr *)0x0;
  local_68._root = 0;
  local_68._closure.super_SQObject._type = OT_NULL;
  local_68._closure.super_SQObject._4_4_ = 0;
  sqvector<SQVM::CallInfo>::resize(&this->_callstackdata,0,&local_68);
  SQObjectPtr::~SQObjectPtr(&local_68._closure);
  SVar8 = (this->_stack)._size;
  if (0 < (long)SVar8) {
    lVar9 = 8;
    do {
      pSVar6 = (this->_stack)._vals;
      plVar7 = *(long **)((long)&(pSVar6->super_SQObject)._type + lVar9);
      uVar4 = *(uint *)((long)pSVar6 + lVar9 + -8);
      *(undefined4 *)((long)pSVar6 + lVar9 + -8) = 0x1000001;
      *(undefined8 *)((long)&(pSVar6->super_SQObject)._type + lVar9) = 0;
      if ((uVar4 >> 0x1b & 1) != 0) {
        plVar2 = plVar7 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar7 + 0x10))();
        }
      }
      lVar9 = lVar9 + 0x10;
      SVar8 = SVar8 - 1;
    } while (SVar8 != 0);
  }
  return;
}

Assistant:

void SQVM::Finalize()
{
    if(_releasehook) { _releasehook(_foreignptr,0); _releasehook = NULL; }
    if(_openouters) CloseOuters(&_stack._vals[0]);
    _roottable.Null();
    _lasterror.Null();
    _errorhandler.Null();
    _debughook = false;
    _debughook_native = NULL;
    _debughook_closure.Null();
    temp_reg.Null();
    _callstackdata.resize(0);
    SQInteger size=_stack.size();
    for(SQInteger i=0;i<size;i++)
        _stack[i].Null();
}